

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::operator*(double c,Matrix4x4 *A)

{
  double *in_RSI;
  Matrix4x4 *in_RDI;
  double in_XMM0_Qa;
  double *cAij;
  double *Aij;
  Matrix4x4 *cA;
  Matrix4x4 *in_stack_ffffffffffffffe0;
  
  Matrix4x4::Matrix4x4(in_stack_ffffffffffffffe0);
  in_RDI->entries[0].x = in_XMM0_Qa * *in_RSI;
  in_RDI->entries[0].y = in_XMM0_Qa * in_RSI[1];
  in_RDI->entries[0].z = in_XMM0_Qa * in_RSI[2];
  in_RDI->entries[0].w = in_XMM0_Qa * in_RSI[3];
  in_RDI->entries[1].x = in_XMM0_Qa * in_RSI[4];
  in_RDI->entries[1].y = in_XMM0_Qa * in_RSI[5];
  in_RDI->entries[1].z = in_XMM0_Qa * in_RSI[6];
  in_RDI->entries[1].w = in_XMM0_Qa * in_RSI[7];
  in_RDI->entries[2].x = in_XMM0_Qa * in_RSI[8];
  in_RDI->entries[2].y = in_XMM0_Qa * in_RSI[9];
  in_RDI->entries[2].z = in_XMM0_Qa * in_RSI[10];
  in_RDI->entries[2].w = in_XMM0_Qa * in_RSI[0xb];
  in_RDI->entries[3].x = in_XMM0_Qa * in_RSI[0xc];
  in_RDI->entries[3].y = in_XMM0_Qa * in_RSI[0xd];
  in_RDI->entries[3].z = in_XMM0_Qa * in_RSI[0xe];
  in_RDI->entries[3].w = in_XMM0_Qa * in_RSI[0xf];
  return in_RDI;
}

Assistant:

Matrix4x4 operator*( double c, const Matrix4x4& A ) {

    Matrix4x4 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);//0
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//4
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//8
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//12
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//15
	//16
    return cA;
  }